

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

bool ApplicativeHelper::isComb(TermList head)

{
  bool bVar1;
  Combinator CVar2;
  Term *this;
  Symbol *this_00;
  Signature *in_RDI;
  undefined8 uVar3;
  undefined1 local_1;
  uint n;
  
  bVar1 = Kernel::TermList::isVar((TermList *)in_RDI);
  if (bVar1) {
    local_1 = false;
  }
  else {
    uVar3 = DAT_01333830;
    this = Kernel::TermList::term((TermList *)0x841539);
    n = (uint)((ulong)uVar3 >> 0x20);
    Kernel::Term::functor(this);
    this_00 = Kernel::Signature::getFunction(in_RDI,n);
    CVar2 = Kernel::Signature::Symbol::combinator(this_00);
    local_1 = CVar2 != NOT_COMB;
  }
  return local_1;
}

Assistant:

bool ApplicativeHelper::isComb(const TermList head)
{
  if(head.isVar()){ return false; }
  return env.signature->getFunction(head.term()->functor())->combinator() != Signature::NOT_COMB;
}